

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void QtPrivate::QDebugStreamOperatorForType<QList<Qt::DayOfWeek>,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  Stream *__old_val;
  long in_FS_OFFSET;
  QDebug local_28;
  QDebug local_20;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (QDebug)dbg->stream;
  (local_18.stream)->ref = (local_18.stream)->ref + 1;
  local_28.stream = (Stream *)0x0;
  printSequentialContainer<QList<Qt::DayOfWeek>>
            ((QtPrivate *)&local_20,(Stream *)&local_18,"QList",(QList<Qt::DayOfWeek> *)a);
  QDebug::~QDebug(&local_18);
  QDebug::~QDebug(&local_20);
  QDebug::~QDebug(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }